

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonReturnFromBlob(JsonParse *pParse,u32 i,sqlite3_context *pCtx,int textOnly)

{
  u8 *puVar1;
  u32 uVar2;
  u32 uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  byte bVar7;
  u8 uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  uint uVar12;
  i64 val;
  sqlite3_context *val_00;
  Mem *pMVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  u32 sz;
  double r;
  sqlite3_int64 iRes;
  JsonParse x;
  uint local_128;
  u8 local_121;
  sqlite3_context *local_120;
  sqlite3 *local_118;
  size_t local_110;
  double local_108;
  JsonString local_100;
  JsonParse local_78;
  
  pMVar13 = pCtx->pOut;
  local_118 = pMVar13->db;
  uVar2 = jsonbPayloadSize(pParse,i,&local_128);
  if (uVar2 == 0) {
    pCtx->isError = 1;
    goto LAB_001ad0ec;
  }
  puVar1 = pParse->aBlob;
  local_120 = pCtx;
  switch(puVar1[i] & 0xf) {
  case 0:
    if (local_128 == 0) {
      if ((pMVar13->flags & 0x9000) == 0) {
        pMVar13->flags = 1;
        return;
      }
      vdbeMemClearExternAndSetNull(pMVar13);
      return;
    }
    break;
  case 1:
    if (local_128 == 0) {
      if ((pMVar13->flags & 0x9000) != 0) {
        val = 1;
LAB_001accf3:
        vdbeReleaseAndSetInt64(pMVar13,val);
        return;
      }
      (pMVar13->u).r = 4.94065645841247e-324;
LAB_001ad07b:
      pMVar13->flags = 4;
      return;
    }
    break;
  case 2:
    if (local_128 == 0) {
      if ((pMVar13->flags & 0x9000) != 0) {
        val = 0;
        goto LAB_001accf3;
      }
      (pMVar13->u).r = 0.0;
      goto LAB_001ad07b;
    }
    break;
  case 3:
  case 4:
    local_100.pCtx = (sqlite3_context *)0x0;
    iVar5 = 3;
    if (local_128 != 0) {
      uVar8 = puVar1[uVar2 + i];
      if (uVar8 == '-') {
        if (local_128 == 1) goto LAB_001acfac;
        uVar2 = uVar2 + 1;
        local_128 = local_128 - 1;
      }
      sVar11 = (size_t)(int)local_128;
      local_121 = uVar8;
      if (puVar1 == (u8 *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = (char *)sqlite3DbMallocRawNN(local_118,sVar11 + 1);
      }
      if (pcVar6 == (char *)0x0) {
        iVar5 = 4;
      }
      else {
        memcpy(pcVar6,puVar1 + (uVar2 + i),sVar11);
        pcVar6[sVar11] = '\0';
        local_110 = sVar11;
        iVar4 = sqlite3DecOrHexToI64(pcVar6,(i64 *)&local_100);
        sqlite3DbFreeNN(local_118,pcVar6);
        if (iVar4 == 0) {
          val_00 = (sqlite3_context *)-(long)local_100.pCtx;
          if (local_121 != '-') {
            val_00 = local_100.pCtx;
          }
          pMVar13 = local_120->pOut;
          if ((pMVar13->flags & 0x9000) != 0) {
            vdbeReleaseAndSetInt64(pMVar13,(i64)val_00);
            return;
          }
          (pMVar13->u).i = (i64)val_00;
          pMVar13->flags = 4;
          return;
        }
        if ((local_121 == '-') && (iVar4 == 3)) {
          pMVar13 = local_120->pOut;
          if ((pMVar13->flags & 0x9000) != 0) {
            vdbeReleaseAndSetInt64(pMVar13,-0x8000000000000000);
            return;
          }
          (pMVar13->u).r = -0.0;
          pMVar13->flags = 4;
          return;
        }
        iVar5 = (uint)(iVar4 != 1) * 2 + 3;
        if ((local_121 == '-') && (iVar4 != 1)) {
          local_128 = (int)local_110 + 1;
          iVar5 = 5;
        }
      }
    }
LAB_001acfac:
    (*(code *)((long)&DAT_001bb79c + (long)(int)(&DAT_001bb79c)[iVar5 - 2]))();
    return;
  case 5:
  case 6:
    if (local_128 != 0) {
      puVar1 = pParse->aBlob;
      sVar11 = (size_t)(int)local_128;
      if (puVar1 == (u8 *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = (char *)sqlite3DbMallocRawNN(local_118,sVar11 + 1);
      }
      if (pcVar6 == (char *)0x0) goto LAB_001ad115;
      memcpy(pcVar6,puVar1 + (uVar2 + i),sVar11);
      pcVar6[sVar11] = '\0';
      sVar11 = strlen(pcVar6);
      iVar5 = sqlite3AtoF(pcVar6,&local_108,(uint)sVar11 & 0x3fffffff,'\x01');
      sqlite3DbFreeNN(local_118,pcVar6);
      if (0 < iVar5) {
        sqlite3VdbeMemSetDouble(local_120->pOut,local_108);
        return;
      }
    }
    break;
  case 7:
  case 10:
    local_78.aBlob = puVar1 + (uVar2 + i);
    uVar8 = '\x01';
    goto LAB_001acc51;
  case 8:
  case 9:
    if (local_118 == (sqlite3 *)0x0) {
      pcVar6 = (char *)sqlite3Malloc((ulong)(local_128 + 1));
    }
    else {
      pcVar6 = (char *)sqlite3DbMallocRawNN(local_118,(ulong)(local_128 + 1));
    }
    if (pcVar6 != (char *)0x0) {
      if (local_128 == 0) {
        uVar15 = 0;
      }
      else {
        uVar12 = 0;
        uVar16 = 0;
        do {
          uVar14 = (uint)uVar16;
          if (puVar1[(ulong)uVar12 + (ulong)(uVar2 + i)] == '\\') {
            uVar3 = jsonUnescapeOneChar((char *)(puVar1 + (ulong)uVar12 + (ulong)(uVar2 + i)),
                                        local_128 - uVar12,(u32 *)&local_100);
            if ((uint)local_100.pCtx < 0x80) {
              iVar5 = 1;
              uVar10 = uVar14;
              uVar9 = (uint)local_100.pCtx;
LAB_001ace31:
              uVar16 = (ulong)(uVar14 + iVar5);
              pcVar6[uVar10] = (char)uVar9;
            }
            else {
              bVar7 = (byte)local_100.pCtx;
              if ((uint)local_100.pCtx < 0x800) {
                uVar10 = uVar14 + 1;
                pcVar6[uVar16] = (byte)((uint)local_100.pCtx >> 6) | 0xc0;
                uVar9 = (uint)(bVar7 & 0x3f | 0x80);
                iVar5 = 2;
                goto LAB_001ace31;
              }
              if ((uint)local_100.pCtx < 0x10000) {
                pcVar6[uVar16] = (byte)((uint)local_100.pCtx >> 0xc) | 0xe0;
                uVar10 = uVar14 + 2;
                pcVar6[uVar14 + 1] = (byte)((uint)local_100.pCtx >> 6) & 0x3f | 0x80;
                uVar9 = (uint)(bVar7 & 0x3f | 0x80);
                iVar5 = 3;
                goto LAB_001ace31;
              }
              if ((uint)local_100.pCtx != 0x99999) {
                pcVar6[uVar16] = (byte)((uint)local_100.pCtx >> 0x12) | 0xf0;
                pcVar6[uVar14 + 1] = (byte)((uint)local_100.pCtx >> 0xc) & 0x3f | 0x80;
                uVar10 = uVar14 + 3;
                pcVar6[uVar14 + 2] = (byte)((uint)local_100.pCtx >> 6) & 0x3f | 0x80;
                uVar9 = (uint)(bVar7 & 0x3f | 0x80);
                iVar5 = 4;
                goto LAB_001ace31;
              }
            }
            uVar12 = (uVar12 + uVar3) - 1;
            uVar15 = uVar16;
          }
          else {
            uVar15 = (ulong)(uVar14 + 1);
            pcVar6[uVar16] = puVar1[(ulong)uVar12 + (ulong)(uVar2 + i)];
          }
          uVar12 = uVar12 + 1;
          uVar16 = uVar15;
        } while (uVar12 < local_128);
      }
      pcVar6[uVar15] = '\0';
      setResultStrOrError(local_120,pcVar6,(int)uVar15,'\x01',sqlite3OomClear);
      if (pcVar6 != (char *)0x0) {
        return;
      }
    }
LAB_001ad115:
    sqlite3_result_error_nomem(local_120);
    return;
  case 0xb:
  case 0xc:
    local_78.aBlob = puVar1 + i;
    if ((textOnly != 0) || (((ulong)pCtx->pFunc->pUserData & 8) == 0)) {
      local_78.zJson = (char *)0x0;
      local_78.db = (sqlite3 *)0x0;
      local_78.nJson = 0;
      local_78.nJPRef = 0;
      local_78.iErr = 0;
      local_78.iDepth = 0;
      local_78.nErr = '\0';
      local_78.oom = '\0';
      local_78.bJsonIsRCStr = '\0';
      local_78.hasNonstd = '\0';
      local_78.bReadOnly = '\0';
      local_78.eEdit = '\0';
      local_78.delta = 0;
      local_78.nIns = 0;
      local_78.iLabel = 0;
      local_78.aIns = (u8 *)0x0;
      local_78.nBlobAlloc = 0;
      local_78.nBlob = local_128 + uVar2;
      local_100.zBuf = local_100.zSpace;
      local_100.nAlloc = 100;
      local_100.nUsed = 0;
      local_100.bStatic = '\x01';
      local_100.eErr = '\0';
      local_100.pCtx = pCtx;
      jsonTranslateBlobToText(&local_78,0,&local_100);
      jsonReturnString(&local_100,(JsonParse *)0x0,(sqlite3_context *)0x0);
      return;
    }
    local_128 = local_128 + uVar2;
    uVar8 = '\0';
LAB_001acc51:
    setResultStrOrError(pCtx,(char *)local_78.aBlob,local_128,uVar8,
                        (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  local_120->isError = 1;
  pMVar13 = local_120->pOut;
LAB_001ad0ec:
  sqlite3VdbeMemSetStr(pMVar13,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
  ;
  return;
}

Assistant:

static void jsonReturnFromBlob(
  JsonParse *pParse,          /* Complete JSON parse tree */
  u32 i,                      /* Index of the node */
  sqlite3_context *pCtx,      /* Return value for this function */
  int textOnly                /* return text JSON.  Disregard user-data */
){
  u32 n, sz;
  int rc;
  sqlite3 *db = sqlite3_context_db_handle(pCtx);

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    sqlite3_result_error(pCtx, "malformed JSON", -1);
    return;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_null(pCtx);
      break;
    }
    case JSONB_TRUE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSONB_FALSE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSONB_INT5:
    case JSONB_INT: {
      sqlite3_int64 iRes = 0;
      char *z;
      int bNeg = 0;
      char x;
      if( sz==0 ) goto returnfromblob_malformed;
      x = (char)pParse->aBlob[i+n];
      if( x=='-' ){
        if( sz<2 ) goto returnfromblob_malformed;
        n++;
        sz--;
        bNeg = 1;
      }
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3DecOrHexToI64(z, &iRes);
      sqlite3DbFree(db, z);
      if( rc==0 ){
        sqlite3_result_int64(pCtx, bNeg ? -iRes : iRes);
      }else if( rc==3 && bNeg ){
        sqlite3_result_int64(pCtx, SMALLEST_INT64);
      }else if( rc==1 ){
        goto returnfromblob_malformed;
      }else{
        if( bNeg ){ n--; sz++; }
        goto to_double;
      }
      break;
    }
    case JSONB_FLOAT5:
    case JSONB_FLOAT: {
      double r;
      char *z;
      if( sz==0 ) goto returnfromblob_malformed;
    to_double:
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
      sqlite3DbFree(db, z);
      if( rc<=0 ) goto returnfromblob_malformed;
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSONB_TEXTRAW:
    case JSONB_TEXT: {
      sqlite3_result_text(pCtx, (char*)&pParse->aBlob[i+n], sz,
                          SQLITE_TRANSIENT);
      break;
    }
    case JSONB_TEXT5:
    case JSONB_TEXTJ: {
      /* Translate JSON formatted string into raw text */
      u32 iIn, iOut;
      const char *z;
      char *zOut;
      u32 nOut = sz;
      z = (const char*)&pParse->aBlob[i+n];
      zOut = sqlite3DbMallocRaw(db, nOut+1);
      if( zOut==0 ) goto returnfromblob_oom;
      for(iIn=iOut=0; iIn<sz; iIn++){
        char c = z[iIn];
        if( c=='\\' ){
          u32 v;
          u32 szEscape = jsonUnescapeOneChar(&z[iIn], sz-iIn, &v);
          if( v<=0x7f ){
            zOut[iOut++] = (char)v;
          }else if( v<=0x7ff ){
            assert( szEscape>=2 );
            zOut[iOut++] = (char)(0xc0 | (v>>6));
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v<0x10000 ){
            assert( szEscape>=3 );
            zOut[iOut++] = 0xe0 | (v>>12);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v==JSON_INVALID_CHAR ){
            /* Silently ignore illegal unicode */
          }else{
            assert( szEscape>=4 );
            zOut[iOut++] = 0xf0 | (v>>18);
            zOut[iOut++] = 0x80 | ((v>>12)&0x3f);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }
          iIn += szEscape - 1;
        }else{
          zOut[iOut++] = c;
        }
      } /* end for() */
      assert( iOut<=nOut );
      zOut[iOut] = 0;
      sqlite3_result_text(pCtx, zOut, iOut, SQLITE_DYNAMIC);
      break;
    }
    case JSONB_ARRAY:
    case JSONB_OBJECT: {
      int flags = textOnly ? 0 : SQLITE_PTR_TO_INT(sqlite3_user_data(pCtx));
      if( flags & JSON_BLOB ){
        sqlite3_result_blob(pCtx, &pParse->aBlob[i], sz+n, SQLITE_TRANSIENT);
      }else{
        jsonReturnTextJsonFromBlob(pCtx, &pParse->aBlob[i], sz+n);
      }
      break;
    }
    default: {
      goto returnfromblob_malformed;
    }
  }
  return;

returnfromblob_oom:
  sqlite3_result_error_nomem(pCtx);
  return;

returnfromblob_malformed:
  sqlite3_result_error(pCtx, "malformed JSON", -1);
  return;
}